

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O1

int StartOtherScanRequestRPLIDAR(RPLIDAR *pRPLIDAR,int scanmodeid)

{
  HANDLE pvVar1;
  int iVar2;
  char cVar3;
  int i;
  int iVar4;
  long lVar5;
  ssize_t sVar6;
  uchar res;
  byte bVar7;
  uchar *esdataresponse;
  char *__s;
  uint uVar8;
  ulong uVar9;
  HANDLE pvVar10;
  int DataType;
  uchar reqbuf [9];
  int SendMode;
  int DataResponseLength;
  fd_set sock_set;
  int local_d4;
  undefined8 local_d0;
  byte local_c8;
  int local_c0;
  int local_bc;
  timeval local_b8;
  fd_set local_a8;
  
  lVar5 = 0;
  local_bc = 0;
  local_c0 = 0;
  local_d4 = 0;
  local_d0 = (ulong)CONCAT13((char)scanmodeid,0x582a5);
  local_c8 = 0;
  do {
    local_c8 = local_c8 ^ *(byte *)((long)&local_d0 + lVar5);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  iVar4 = (pRPLIDAR->RS232Port).DevType;
  if (iVar4 - 1U < 4) {
    iVar4 = (pRPLIDAR->RS232Port).s;
    uVar9 = 0;
    do {
      sVar6 = send(iVar4,(void *)((long)&local_d0 + uVar9),(long)(9 - (int)uVar9),0);
      if ((int)sVar6 < 1) goto LAB_0012385c;
      uVar8 = (int)uVar9 + (int)sVar6;
      uVar9 = (ulong)uVar8;
    } while ((int)uVar8 < 9);
  }
  else {
    if (iVar4 != 0) {
LAB_0012385c:
      __s = "Error writing data to a RPLIDAR. ";
      goto LAB_00123863;
    }
    iVar4 = *(int *)&(pRPLIDAR->RS232Port).hDev;
    uVar9 = 0;
    do {
      sVar6 = write(iVar4,(void *)((long)&local_d0 + uVar9),(ulong)(9 - (int)uVar9));
      if ((int)sVar6 < 1) goto LAB_0012385c;
      uVar8 = (int)uVar9 + (int)sVar6;
      uVar9 = (ulong)uVar8;
    } while (uVar8 < 9);
  }
  iVar4 = GetResponseDescriptorRPLIDAR(pRPLIDAR,&local_bc,&local_c0,&local_d4);
  if (iVar4 != 0) {
    return 1;
  }
  if ((((local_bc != 0x54 && local_bc != 0x84) || (local_c0 != 1)) || (3 < local_d4 - 0x82U)) ||
     (local_d4 - 0x82U == 1)) {
    puts("A RPLIDAR is not responding correctly : Bad response descriptor. ");
    return 1;
  }
  iVar4 = (pRPLIDAR->RS232Port).DevType;
  if (iVar4 - 1U < 4) {
    iVar4 = (pRPLIDAR->RS232Port).s;
    local_b8.tv_sec = 1;
    local_b8.tv_usec = 500000;
    local_a8.fds_bits[0xe] = 0;
    local_a8.fds_bits[0xf] = 0;
    local_a8.fds_bits[0xc] = 0;
    local_a8.fds_bits[0xd] = 0;
    local_a8.fds_bits[10] = 0;
    local_a8.fds_bits[0xb] = 0;
    local_a8.fds_bits[8] = 0;
    local_a8.fds_bits[9] = 0;
    local_a8.fds_bits[6] = 0;
    local_a8.fds_bits[7] = 0;
    local_a8.fds_bits[4] = 0;
    local_a8.fds_bits[5] = 0;
    iVar2 = iVar4 + 0x3f;
    if (-1 < iVar4) {
      iVar2 = iVar4;
    }
    bVar7 = (byte)(iVar4 % 0x40);
    local_a8.fds_bits[2] = 0;
    local_a8.fds_bits[3] = 0;
    local_a8.fds_bits[0] = 0;
    local_a8.fds_bits[1] = 0;
    local_a8.fds_bits[iVar2 >> 6] = local_a8.fds_bits[iVar2 >> 6] | 1L << (bVar7 & 0x3f);
    iVar4 = select(iVar4 + 1,&local_a8,(fd_set *)0x0,(fd_set *)0x0,&local_b8);
    bVar7 = bVar7 & 0x3f;
    local_a8.fds_bits[iVar2 >> 6] =
         local_a8.fds_bits[iVar2 >> 6] & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
LAB_00123916:
    cVar3 = '\x01';
    if (iVar4 != -1) {
      cVar3 = (iVar4 == 0) * '\x02';
    }
  }
  else {
    cVar3 = '\x01';
    if (iVar4 == 0) {
      pvVar1 = (pRPLIDAR->RS232Port).hDev;
      local_a8.fds_bits[0] = 0;
      local_a8.fds_bits[1] = 0;
      local_a8.fds_bits[2] = 0;
      local_a8.fds_bits[3] = 0;
      local_a8.fds_bits[4] = 0;
      local_a8.fds_bits[5] = 0;
      local_a8.fds_bits[6] = 0;
      local_a8.fds_bits[7] = 0;
      local_a8.fds_bits[8] = 0;
      local_a8.fds_bits[9] = 0;
      local_a8.fds_bits[10] = 0;
      local_a8.fds_bits[0xb] = 0;
      local_a8.fds_bits[0xc] = 0;
      local_a8.fds_bits[0xd] = 0;
      local_a8.fds_bits[0xe] = 0;
      local_a8.fds_bits[0xf] = 0;
      pvVar10 = (HANDLE)((long)pvVar1 + 0x3f);
      if (-1 < (long)pvVar1) {
        pvVar10 = pvVar1;
      }
      local_a8.fds_bits[(long)pvVar10 >> 6] =
           local_a8.fds_bits[(long)pvVar10 >> 6] | 1L << ((byte)pvVar1 & 0x3f);
      local_b8.tv_sec = 1;
      local_b8.tv_usec = 500000;
      iVar4 = select((int)pvVar1 + 1,&local_a8,(fd_set *)0x0,(fd_set *)0x0,&local_b8);
      bVar7 = (byte)pvVar1 & 0x3f;
      local_a8.fds_bits[(long)pvVar10 >> 6] =
           local_a8.fds_bits[(long)pvVar10 >> 6] &
           (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
      goto LAB_00123916;
    }
  }
  if (cVar3 != '\0') {
    __s = "A RPLIDAR is not responding correctly. ";
LAB_00123863:
    puts(__s);
    return 1;
  }
  pRPLIDAR->esversion = local_d4;
  if (local_d4 == 0x85) {
    esdataresponse = pRPLIDAR->desdata_prev;
    pRPLIDAR->desdata_prev[0x40] = '\0';
    pRPLIDAR->desdata_prev[0x41] = '\0';
    pRPLIDAR->desdata_prev[0x42] = '\0';
    pRPLIDAR->desdata_prev[0x43] = '\0';
    pRPLIDAR->desdata_prev[0x44] = '\0';
    pRPLIDAR->desdata_prev[0x45] = '\0';
    pRPLIDAR->desdata_prev[0x46] = '\0';
    pRPLIDAR->desdata_prev[0x47] = '\0';
    pRPLIDAR->desdata_prev[0x48] = '\0';
    pRPLIDAR->desdata_prev[0x49] = '\0';
    pRPLIDAR->desdata_prev[0x4a] = '\0';
    pRPLIDAR->desdata_prev[0x4b] = '\0';
    pRPLIDAR->desdata_prev[0x4c] = '\0';
    pRPLIDAR->desdata_prev[0x4d] = '\0';
    pRPLIDAR->desdata_prev[0x4e] = '\0';
    pRPLIDAR->desdata_prev[0x4f] = '\0';
    pRPLIDAR->desdata_prev[0x30] = '\0';
    pRPLIDAR->desdata_prev[0x31] = '\0';
    pRPLIDAR->desdata_prev[0x32] = '\0';
    pRPLIDAR->desdata_prev[0x33] = '\0';
    pRPLIDAR->desdata_prev[0x34] = '\0';
    pRPLIDAR->desdata_prev[0x35] = '\0';
    pRPLIDAR->desdata_prev[0x36] = '\0';
    pRPLIDAR->desdata_prev[0x37] = '\0';
    pRPLIDAR->desdata_prev[0x38] = '\0';
    pRPLIDAR->desdata_prev[0x39] = '\0';
    pRPLIDAR->desdata_prev[0x3a] = '\0';
    pRPLIDAR->desdata_prev[0x3b] = '\0';
    pRPLIDAR->desdata_prev[0x3c] = '\0';
    pRPLIDAR->desdata_prev[0x3d] = '\0';
    pRPLIDAR->desdata_prev[0x3e] = '\0';
    pRPLIDAR->desdata_prev[0x3f] = '\0';
    pRPLIDAR->desdata_prev[0x20] = '\0';
    pRPLIDAR->desdata_prev[0x21] = '\0';
    pRPLIDAR->desdata_prev[0x22] = '\0';
    pRPLIDAR->desdata_prev[0x23] = '\0';
    pRPLIDAR->desdata_prev[0x24] = '\0';
    pRPLIDAR->desdata_prev[0x25] = '\0';
    pRPLIDAR->desdata_prev[0x26] = '\0';
    pRPLIDAR->desdata_prev[0x27] = '\0';
    pRPLIDAR->desdata_prev[0x28] = '\0';
    pRPLIDAR->desdata_prev[0x29] = '\0';
    pRPLIDAR->desdata_prev[0x2a] = '\0';
    pRPLIDAR->desdata_prev[0x2b] = '\0';
    pRPLIDAR->desdata_prev[0x2c] = '\0';
    pRPLIDAR->desdata_prev[0x2d] = '\0';
    pRPLIDAR->desdata_prev[0x2e] = '\0';
    pRPLIDAR->desdata_prev[0x2f] = '\0';
    pRPLIDAR->desdata_prev[0x10] = '\0';
    pRPLIDAR->desdata_prev[0x11] = '\0';
    pRPLIDAR->desdata_prev[0x12] = '\0';
    pRPLIDAR->desdata_prev[0x13] = '\0';
    pRPLIDAR->desdata_prev[0x14] = '\0';
    pRPLIDAR->desdata_prev[0x15] = '\0';
    pRPLIDAR->desdata_prev[0x16] = '\0';
    pRPLIDAR->desdata_prev[0x17] = '\0';
    pRPLIDAR->desdata_prev[0x18] = '\0';
    pRPLIDAR->desdata_prev[0x19] = '\0';
    pRPLIDAR->desdata_prev[0x1a] = '\0';
    pRPLIDAR->desdata_prev[0x1b] = '\0';
    pRPLIDAR->desdata_prev[0x1c] = '\0';
    pRPLIDAR->desdata_prev[0x1d] = '\0';
    pRPLIDAR->desdata_prev[0x1e] = '\0';
    pRPLIDAR->desdata_prev[0x1f] = '\0';
    pRPLIDAR->desdata_prev[0] = '\0';
    pRPLIDAR->desdata_prev[1] = '\0';
    pRPLIDAR->desdata_prev[2] = '\0';
    pRPLIDAR->desdata_prev[3] = '\0';
    pRPLIDAR->desdata_prev[4] = '\0';
    pRPLIDAR->desdata_prev[5] = '\0';
    pRPLIDAR->desdata_prev[6] = '\0';
    pRPLIDAR->desdata_prev[7] = '\0';
    pRPLIDAR->desdata_prev[8] = '\0';
    pRPLIDAR->desdata_prev[9] = '\0';
    pRPLIDAR->desdata_prev[10] = '\0';
    pRPLIDAR->desdata_prev[0xb] = '\0';
    pRPLIDAR->desdata_prev[0xc] = '\0';
    pRPLIDAR->desdata_prev[0xd] = '\0';
    pRPLIDAR->desdata_prev[0xe] = '\0';
    pRPLIDAR->desdata_prev[0xf] = '\0';
    pRPLIDAR->desdata_prev[0x50] = '\0';
    pRPLIDAR->desdata_prev[0x51] = '\0';
    pRPLIDAR->desdata_prev[0x52] = '\0';
    pRPLIDAR->desdata_prev[0x53] = '\0';
  }
  else {
    if (local_d4 == 0x84) {
      memset(pRPLIDAR->eesdata_prev,0,0x84);
      iVar4 = GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR,pRPLIDAR->eesdata_prev,0x84);
      if (iVar4 != 0) {
        return 1;
      }
      puts(
          "A RPLIDAR is not responding correctly : Unhandled response descriptor, please try another scan mode or rebuild using RPLIDAR SDK. "
          );
      return 0x11;
    }
    if (local_d4 != 0x82) {
      __s = "A RPLIDAR is not responding correctly : Unhandled response descriptor. ";
      goto LAB_00123863;
    }
    esdataresponse = pRPLIDAR->esdata_prev;
    pRPLIDAR->esdata_prev[0x40] = '\0';
    pRPLIDAR->esdata_prev[0x41] = '\0';
    pRPLIDAR->esdata_prev[0x42] = '\0';
    pRPLIDAR->esdata_prev[0x43] = '\0';
    pRPLIDAR->esdata_prev[0x44] = '\0';
    pRPLIDAR->esdata_prev[0x45] = '\0';
    pRPLIDAR->esdata_prev[0x46] = '\0';
    pRPLIDAR->esdata_prev[0x47] = '\0';
    pRPLIDAR->esdata_prev[0x48] = '\0';
    pRPLIDAR->esdata_prev[0x49] = '\0';
    pRPLIDAR->esdata_prev[0x4a] = '\0';
    pRPLIDAR->esdata_prev[0x4b] = '\0';
    pRPLIDAR->esdata_prev[0x4c] = '\0';
    pRPLIDAR->esdata_prev[0x4d] = '\0';
    pRPLIDAR->esdata_prev[0x4e] = '\0';
    pRPLIDAR->esdata_prev[0x4f] = '\0';
    pRPLIDAR->esdata_prev[0x30] = '\0';
    pRPLIDAR->esdata_prev[0x31] = '\0';
    pRPLIDAR->esdata_prev[0x32] = '\0';
    pRPLIDAR->esdata_prev[0x33] = '\0';
    pRPLIDAR->esdata_prev[0x34] = '\0';
    pRPLIDAR->esdata_prev[0x35] = '\0';
    pRPLIDAR->esdata_prev[0x36] = '\0';
    pRPLIDAR->esdata_prev[0x37] = '\0';
    pRPLIDAR->esdata_prev[0x38] = '\0';
    pRPLIDAR->esdata_prev[0x39] = '\0';
    pRPLIDAR->esdata_prev[0x3a] = '\0';
    pRPLIDAR->esdata_prev[0x3b] = '\0';
    pRPLIDAR->esdata_prev[0x3c] = '\0';
    pRPLIDAR->esdata_prev[0x3d] = '\0';
    pRPLIDAR->esdata_prev[0x3e] = '\0';
    pRPLIDAR->esdata_prev[0x3f] = '\0';
    pRPLIDAR->esdata_prev[0x20] = '\0';
    pRPLIDAR->esdata_prev[0x21] = '\0';
    pRPLIDAR->esdata_prev[0x22] = '\0';
    pRPLIDAR->esdata_prev[0x23] = '\0';
    pRPLIDAR->esdata_prev[0x24] = '\0';
    pRPLIDAR->esdata_prev[0x25] = '\0';
    pRPLIDAR->esdata_prev[0x26] = '\0';
    pRPLIDAR->esdata_prev[0x27] = '\0';
    pRPLIDAR->esdata_prev[0x28] = '\0';
    pRPLIDAR->esdata_prev[0x29] = '\0';
    pRPLIDAR->esdata_prev[0x2a] = '\0';
    pRPLIDAR->esdata_prev[0x2b] = '\0';
    pRPLIDAR->esdata_prev[0x2c] = '\0';
    pRPLIDAR->esdata_prev[0x2d] = '\0';
    pRPLIDAR->esdata_prev[0x2e] = '\0';
    pRPLIDAR->esdata_prev[0x2f] = '\0';
    pRPLIDAR->esdata_prev[0x10] = '\0';
    pRPLIDAR->esdata_prev[0x11] = '\0';
    pRPLIDAR->esdata_prev[0x12] = '\0';
    pRPLIDAR->esdata_prev[0x13] = '\0';
    pRPLIDAR->esdata_prev[0x14] = '\0';
    pRPLIDAR->esdata_prev[0x15] = '\0';
    pRPLIDAR->esdata_prev[0x16] = '\0';
    pRPLIDAR->esdata_prev[0x17] = '\0';
    pRPLIDAR->esdata_prev[0x18] = '\0';
    pRPLIDAR->esdata_prev[0x19] = '\0';
    pRPLIDAR->esdata_prev[0x1a] = '\0';
    pRPLIDAR->esdata_prev[0x1b] = '\0';
    pRPLIDAR->esdata_prev[0x1c] = '\0';
    pRPLIDAR->esdata_prev[0x1d] = '\0';
    pRPLIDAR->esdata_prev[0x1e] = '\0';
    pRPLIDAR->esdata_prev[0x1f] = '\0';
    pRPLIDAR->esdata_prev[0] = '\0';
    pRPLIDAR->esdata_prev[1] = '\0';
    pRPLIDAR->esdata_prev[2] = '\0';
    pRPLIDAR->esdata_prev[3] = '\0';
    pRPLIDAR->esdata_prev[4] = '\0';
    pRPLIDAR->esdata_prev[5] = '\0';
    pRPLIDAR->esdata_prev[6] = '\0';
    pRPLIDAR->esdata_prev[7] = '\0';
    pRPLIDAR->esdata_prev[8] = '\0';
    pRPLIDAR->esdata_prev[9] = '\0';
    pRPLIDAR->esdata_prev[10] = '\0';
    pRPLIDAR->esdata_prev[0xb] = '\0';
    pRPLIDAR->esdata_prev[0xc] = '\0';
    pRPLIDAR->esdata_prev[0xd] = '\0';
    pRPLIDAR->esdata_prev[0xe] = '\0';
    pRPLIDAR->esdata_prev[0xf] = '\0';
    pRPLIDAR->esdata_prev[0x50] = '\0';
    pRPLIDAR->esdata_prev[0x51] = '\0';
    pRPLIDAR->esdata_prev[0x52] = '\0';
    pRPLIDAR->esdata_prev[0x53] = '\0';
  }
  iVar4 = GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR,esdataresponse,0x54);
  if (iVar4 != 0) {
    return 1;
  }
  return 0;
}

Assistant:

inline int StartOtherScanRequestRPLIDAR(RPLIDAR* pRPLIDAR, int scanmodeid)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
	if (SL_IS_FAIL(pRPLIDAR->drv->startScanExpress(false, (unsigned short)scanmodeid)))
	{
		printf("A RPLIDAR is not responding correctly : startScanExpress() failed. \n");
		return EXIT_FAILURE;
	}
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,EXPRESS_SCAN_REQUEST_RPLIDAR,0x05,0,0,0,0,0,0};
	int DataResponseLength = 0, SendMode = 0, DataType = 0;

	reqbuf[3] = (unsigned char)scanmodeid;
	reqbuf[8] = ComputeChecksumRPLIDAR(reqbuf, sizeof(reqbuf));

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	// Receive the response descriptor.
	if (GetResponseDescriptorRPLIDAR(pRPLIDAR, &DataResponseLength, &SendMode, &DataType) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Quick check of the response descriptor.
	if (((DataResponseLength != NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)&&(DataResponseLength != NB_BYTES_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)&&(DataResponseLength != NB_BYTES_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR))||
		(SendMode != SINGLE_REQUEST_MULTIPLE_RESPONSE_SEND_MODE_RPLIDAR)||
		((DataType != MEASUREMENT_CAPSULED_RESPONSE_RPLIDAR)&&(DataType != MEASUREMENT_CAPSULED_ULTRA_RESPONSE_RPLIDAR)&&(DataType != MEASUREMENT_DENSE_CAPSULED_RESPONSE_RPLIDAR)))
	{ 
		printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
		return EXIT_FAILURE;	
	}

	// The first data response might take some time to come, see https://github.com/ENSTABretagneRobotics/Hardware-MATLAB/issues/2...
	if (WaitForRS232Port(&pRPLIDAR->RS232Port, 1500, 5) != EXIT_SUCCESS)
	{
		printf("A RPLIDAR is not responding correctly. \n");
		return EXIT_FAILURE;
	}

	pRPLIDAR->esversion = DataType;

	// Receive the first data response (2 data responses needed for angles computation...).
	switch (pRPLIDAR->esversion)
	{
	case MEASUREMENT_CAPSULED_RESPONSE_RPLIDAR:
		PRINT_DEBUG_MESSAGE(("RPLIDAR Legacy Express Scan\n"));
		memset(pRPLIDAR->esdata_prev, 0, sizeof(pRPLIDAR->esdata_prev));
		if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, pRPLIDAR->esdata_prev, NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		break;
	case MEASUREMENT_CAPSULED_ULTRA_RESPONSE_RPLIDAR:
		PRINT_DEBUG_MESSAGE(("RPLIDAR Extended Express Scan\n"));
		memset(pRPLIDAR->eesdata_prev, 0, sizeof(pRPLIDAR->eesdata_prev));
		if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, pRPLIDAR->eesdata_prev, NB_BYTES_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}

		// Need to update GetOtherScanDataResponseRPLIDAR()...

		printf("A RPLIDAR is not responding correctly : Unhandled response descriptor, please try another scan mode or rebuild using RPLIDAR SDK. \n");
		return EXIT_NOT_IMPLEMENTED;
		//break;
	case MEASUREMENT_DENSE_CAPSULED_RESPONSE_RPLIDAR:
		PRINT_DEBUG_MESSAGE(("RPLIDAR Dense Express Scan\n"));
		memset(pRPLIDAR->desdata_prev, 0, sizeof(pRPLIDAR->desdata_prev));
		if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, pRPLIDAR->desdata_prev, NB_BYTES_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		break;
	default:
		printf("A RPLIDAR is not responding correctly : Unhandled response descriptor. \n");
		return EXIT_FAILURE;
		//break;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
	return EXIT_SUCCESS;
}